

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::stream_socket::async_read(stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  bool bVar1;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *this_00;
  reader_all *in_RSI;
  basic_io_device *in_RDI;
  pointer r;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *this_01;
  reader_all *in_stack_ffffffffffffffb8;
  io_handler *in_stack_ffffffffffffffc0;
  mutable_buffer *in_stack_ffffffffffffffd0;
  stream_socket *in_stack_ffffffffffffffd8;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> in_stack_ffffffffffffffe0;
  
  bVar1 = basic_io_device::dont_block(in_RDI,in_stack_ffffffffffffffc0);
  if (bVar1) {
    this_00 = (intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)operator_new(0x58);
    anon_unknown_15::reader_all::reader_all
              (in_stack_ffffffffffffffe0.p_,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (io_handler *)in_RDI);
    this_01 = (intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> *)
              &stack0xffffffffffffffe0;
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::intrusive_ptr
              (this_00,in_stack_ffffffffffffffb8,SUB81((ulong)this_01 >> 0x38,0));
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::operator->(this_01);
    anon_unknown_15::reader_all::run(in_RSI);
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr(this_01);
  }
  return;
}

Assistant:

void stream_socket::async_read(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	reader_all::pointer r(new reader_all(this,buffer,h));
	r->run();
}